

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMatrixSolver.cpp
# Opt level: O0

void __thiscall
TPZMatrixSolver<double>::TPZMatrixSolver
          (TPZMatrixSolver<double> *this,void **vtt,TPZAutoPointer<TPZMatrix<double>_> *Refmat)

{
  TPZAutoPointer<TPZMatrix<double>_> *in_RDX;
  TPZAutoPointer<TPZMatrix<double>_> *in_RSI;
  undefined8 *in_RDI;
  TPZAutoPointer<TPZMatrix<double>_> *copy;
  TPZFMatrix<double> *in_stack_ffffffffffffffe0;
  
  TPZSolver::TPZSolver((TPZSolver *)in_RSI,&in_RDX->fRef);
  *in_RDI = in_RSI->fRef;
  TPZAutoPointer<TPZMatrix<double>_>::TPZAutoPointer(in_RSI);
  copy = (TPZAutoPointer<TPZMatrix<double>_> *)(in_RDI + 2);
  TPZFMatrix<double>::TPZFMatrix(in_stack_ffffffffffffffe0);
  TPZAutoPointer<TPZMatrix<double>_>::TPZAutoPointer(in_RSI);
  TPZAutoPointer<TPZMatrix<double>_>::operator=(in_RDX,copy);
  return;
}

Assistant:

TPZMatrixSolver<TVar>::TPZMatrixSolver(TPZAutoPointer<TPZMatrix<TVar> > Refmat) :
fScratch()
{
	fContainer = Refmat;
}